

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void MirrorUVRow_C(uint8_t *src_uv,uint8_t *dst_uv,int width)

{
  uint8_t *puVar1;
  long lVar2;
  
  puVar1 = src_uv + (width * 2 + -2);
  lVar2 = 0;
  if (width < 1) {
    width = 0;
  }
  for (; width != (int)lVar2; lVar2 = lVar2 + 1) {
    dst_uv[lVar2 * 2] = *puVar1;
    dst_uv[lVar2 * 2 + 1] = puVar1[1];
    puVar1 = puVar1 + -2;
  }
  return;
}

Assistant:

void MirrorUVRow_C(const uint8_t* src_uv, uint8_t* dst_uv, int width) {
  int x;
  src_uv += (width - 1) << 1;
  for (x = 0; x < width; ++x) {
    dst_uv[0] = src_uv[0];
    dst_uv[1] = src_uv[1];
    src_uv -= 2;
    dst_uv += 2;
  }
}